

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

bool duckdb::Time::TryConvertTime
               (char *buf,idx_t len,idx_t *pos,dtime_t *result,bool strict,
               optional_ptr<int,_true> nanos)

{
  bool bVar1;
  TimestampCastResult TVar2;
  dtime_t dVar3;
  timestamp_t timestamp;
  timestamp_t local_30;
  
  bVar1 = TryConvertInternal(buf,len,pos,result,strict,nanos);
  if (bVar1) {
    bVar1 = result->micros < 0x141dd76001;
  }
  else {
    if ((!strict) &&
       (TVar2 = Timestamp::TryConvertTimestamp(buf,len,&local_30,nanos,false), TVar2 == SUCCESS)) {
      if (local_30.value == -0x7fffffffffffffff) {
        return false;
      }
      if (local_30.value == 0x7fffffffffffffff) {
        return false;
      }
      dVar3 = Timestamp::GetTime(local_30);
      result->micros = (int64_t)dVar3;
      return true;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Time::TryConvertTime(const char *buf, idx_t len, idx_t &pos, dtime_t &result, bool strict,
                          optional_ptr<int32_t> nanos) {
	if (!Time::TryConvertInternal(buf, len, pos, result, strict, nanos)) {
		if (!strict) {
			// last chance, check if we can parse as timestamp
			timestamp_t timestamp;
			if (Timestamp::TryConvertTimestamp(buf, len, timestamp, nanos) == TimestampCastResult::SUCCESS) {
				if (!Timestamp::IsFinite(timestamp)) {
					return false;
				}
				result = Timestamp::GetTime(timestamp);
				return true;
			}
		}
		return false;
	}
	return result.micros <= Interval::MICROS_PER_DAY;
}